

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_aesdec_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  uint uVar1;
  uint32_t uVar2;
  uint local_a8 [2];
  ZMMReg rk;
  ZMMReg st;
  ZMMReg *pZStack_20;
  int i;
  ZMMReg *s_local;
  ZMMReg *d_local;
  CPUX86State *env_local;
  
  pZStack_20 = s;
  s_local = d;
  d_local = (ZMMReg *)env;
  memcpy(rk._b_ZMMReg + 0x38,d,0x40);
  memcpy(local_a8,pZStack_20,0x40);
  for (st._l_ZMMReg[0xf] = 0; (int)st._l_ZMMReg[0xf] < 4; st._l_ZMMReg[0xf] = st._l_ZMMReg[0xf] + 1)
  {
    uVar1 = local_a8[(int)st._l_ZMMReg[0xf]];
    uVar2 = bswap32(AES_Td0[rk._b_ZMMReg[(ulong)""[(int)(st._l_ZMMReg[0xf] << 2)] + 0x38]] ^
                    AES_Td1[rk._b_ZMMReg[(ulong)""[(int)(st._l_ZMMReg[0xf] * 4 + 1)] + 0x38]] ^
                    AES_Td2[rk._b_ZMMReg[(ulong)""[(int)(st._l_ZMMReg[0xf] * 4 + 2)] + 0x38]] ^
                    AES_Td3[rk._b_ZMMReg[(ulong)""[(int)(st._l_ZMMReg[0xf] * 4 + 3)] + 0x38]]);
    s_local->_l_ZMMReg[(int)st._l_ZMMReg[0xf]] = uVar1 ^ uVar2;
  }
  return;
}

Assistant:

void glue(helper_aesdec, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int i;
    Reg st = *d;
    Reg rk = *s;

    for (i = 0 ; i < 4 ; i++) {
        d->L(i) = rk.L(i) ^ bswap32(AES_Td0[st.B(AES_ishifts[4*i+0])] ^
                                    AES_Td1[st.B(AES_ishifts[4*i+1])] ^
                                    AES_Td2[st.B(AES_ishifts[4*i+2])] ^
                                    AES_Td3[st.B(AES_ishifts[4*i+3])]);
    }
}